

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movieTickets.cpp
# Opt level: O2

void getInput(string *movieName,double *adultTicketPrice,double *childTicketPrice,
             int *noOfAdultTicketSold,int *noOfChildTicketSold,double *percentageDonation)

{
  std::operator<<((ostream *)&std::cout,"Name of the movie: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)movieName);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Adult ticket price: ");
  std::istream::_M_extract<double>((double *)&std::cin);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Child ticket price: ");
  std::istream::_M_extract<double>((double *)&std::cin);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Number of adult tickets sold: ");
  std::istream::operator>>((istream *)&std::cin,noOfAdultTicketSold);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Number of child tickets sold: ");
  std::istream::operator>>((istream *)&std::cin,noOfChildTicketSold);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Gross percentage that you would like to donate: ");
  std::istream::_M_extract<double>((double *)&std::cin);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void getInput(string& movieName, double& adultTicketPrice,
              double& childTicketPrice, int& noOfAdultTicketSold,
              int& noOfChildTicketSold, double& percentageDonation) {

    cout << "Name of the movie: ";
    getline(cin, movieName);
    cout << endl;

    cout << "Adult ticket price: ";
    cin >> adultTicketPrice;
    cout << endl;

    cout << "Child ticket price: ";
    cin >> childTicketPrice;
    cout << endl;

    cout << "Number of adult tickets sold: ";
    cin >> noOfAdultTicketSold;
    cout << endl;

    cout << "Number of child tickets sold: ";
    cin >> noOfChildTicketSold;
    cout << endl;

    cout << "Gross percentage that you would like to donate: ";
    cin >> percentageDonation;
    cout << endl;

}